

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::createConversion
          (TIntermediate *this,TBasicType convertTo,TIntermTyped *node)

{
  uint uVar1;
  TOperator op;
  int iVar2;
  TBasicType src;
  int mc;
  int mr;
  undefined4 extraout_var;
  TIntermUnary *node_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar3;
  TIntermediate *pTVar4;
  long lVar5;
  undefined4 extraout_var_03;
  TBasicType TVar6;
  bool bVar7;
  bool bVar8;
  TOperator newOp;
  TType newType;
  TOperator local_cc;
  TType local_c8;
  undefined4 extraout_var_02;
  
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
  bVar8 = true;
  bVar7 = true;
  if (iVar2 != 4) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    bVar7 = true;
    if (iVar2 != 5) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
      bVar7 = true;
      if (iVar2 != 6) {
        iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
        bVar7 = true;
        if (iVar2 != 7) {
          iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          bVar7 = true;
          if (iVar2 != 8) {
            iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
            bVar7 = true;
            if (iVar2 != 9) {
              iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
              bVar7 = true;
              if (iVar2 != 10) {
                iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
                bVar7 = iVar2 == 0xb;
              }
            }
          }
        }
      }
    }
  }
  TVar6 = convertTo & ~EbtFloat;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
  if ((iVar2 != 3) &&
     (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node), iVar2 != 1)) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    bVar8 = iVar2 == 2;
  }
  uVar1 = convertTo - EbtInt8;
  if ((bool)(TVar6 == EbtInt8 & (bVar7 ^ 1U))) {
LAB_0038adca:
    if (((this->numericFeatures).features & 3) == 0) {
      return (TIntermTyped *)0x0;
    }
  }
  else {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    if (iVar2 == 4) {
      if (7 < uVar1) goto LAB_0038adca;
    }
    else {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
      if ((7 < uVar1) && (iVar2 == 5)) goto LAB_0038adca;
    }
  }
  if ((bool)(TVar6 == EbtInt16 & (bVar7 ^ 1U))) {
LAB_0038ae18:
    if (((this->numericFeatures).features & 0x405) == 0) {
      return (TIntermTyped *)0x0;
    }
LAB_0038ae2e:
    if ((bool)(bVar8 | convertTo != EbtFloat16)) goto LAB_0038ae3e;
  }
  else {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    if (iVar2 != 6) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
      if ((7 < uVar1) && (iVar2 == 7)) goto LAB_0038ae18;
      goto LAB_0038ae2e;
    }
    if (7 < uVar1) goto LAB_0038ae18;
LAB_0038ae3e:
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    if ((convertTo - EbtFloat < 3) || (iVar2 != 3)) goto LAB_0038ae6e;
  }
  if (((this->numericFeatures).features & 0x821) == 0) {
    return (TIntermTyped *)0x0;
  }
LAB_0038ae6e:
  local_cc = EOpNull;
  pTVar4 = (TIntermediate *)node;
  src = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
  bVar7 = buildConvertOp(pTVar4,convertTo,src,&local_cc);
  if (!bVar7) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
  mc = (*(node->super_TIntermNode)._vptr_TIntermNode[0x27])(node);
  mr = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
  TType::TType(&local_c8,convertTo,EvqTemporary,iVar2,mc,mr,false);
  op = local_cc;
  pTVar4 = (TIntermediate *)node;
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  node_00 = addUnaryNode(pTVar4,op,node,(TSourceLoc *)CONCAT44(extraout_var,iVar2),&local_c8);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
  if ((((CONCAT44(extraout_var_00,iVar2) != 0) &&
       (uVar1 = (this->numericFeatures).features, (uVar1 & 3) != 0 || TVar6 != EbtInt8)) &&
      ((uVar1 & 0x405) != 0 || TVar6 != EbtInt16)) &&
     ((uVar1 & 0x821) != 0 || convertTo != EbtFloat16)) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
    pTVar3 = (TIntermTyped *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x188))
                       ((long *)CONCAT44(extraout_var_01,iVar2),op,&local_c8);
    if (pTVar3 != (TIntermTyped *)0x0) {
      return pTVar3;
    }
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  pTVar4 = (TIntermediate *)CONCAT44(extraout_var_02,iVar2);
  lVar5 = (**(code **)(*(long *)pTVar4 + 0x58))();
  if ((*(byte *)(lVar5 + 0xc) & 1) != 0) {
    bVar7 = isSpecializationOperation(pTVar4,&node_00->super_TIntermOperator);
    if (bVar7) {
      iVar2 = (*(node_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1f])(node_00);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_03,iVar2));
      *(ulong *)(lVar5 + 8) = (*(ulong *)(lVar5 + 8) & 0xfffffffeffffff80) + 0x100000002;
      return (TIntermTyped *)node_00;
    }
    return (TIntermTyped *)node_00;
  }
  return (TIntermTyped *)node_00;
}

Assistant:

TIntermTyped* TIntermediate::createConversion(TBasicType convertTo, TIntermTyped* node) const
{
    //
    // Add a new newNode for the conversion.
    //

    bool convertToIntTypes = (convertTo == EbtInt8  || convertTo == EbtUint8  ||
                              convertTo == EbtInt16 || convertTo == EbtUint16 ||
                              convertTo == EbtInt   || convertTo == EbtUint   ||
                              convertTo == EbtInt64 || convertTo == EbtUint64);

    bool convertFromIntTypes = (node->getBasicType() == EbtInt8  || node->getBasicType() == EbtUint8  ||
                                node->getBasicType() == EbtInt16 || node->getBasicType() == EbtUint16 ||
                                node->getBasicType() == EbtInt   || node->getBasicType() == EbtUint   ||
                                node->getBasicType() == EbtInt64 || node->getBasicType() == EbtUint64);

    bool convertToFloatTypes = (convertTo == EbtFloat16 || convertTo == EbtFloat || convertTo == EbtDouble);

    bool convertFromFloatTypes = (node->getBasicType() == EbtFloat16 ||
                                  node->getBasicType() == EbtFloat ||
                                  node->getBasicType() == EbtDouble);

    if (((convertTo == EbtInt8 || convertTo == EbtUint8) && ! convertFromIntTypes) ||
        ((node->getBasicType() == EbtInt8 || node->getBasicType() == EbtUint8) && ! convertToIntTypes)) {
        if (! getArithemeticInt8Enabled()) {
            return nullptr;
        }
    }

    if (((convertTo == EbtInt16 || convertTo == EbtUint16) && ! convertFromIntTypes) ||
        ((node->getBasicType() == EbtInt16 || node->getBasicType() == EbtUint16) && ! convertToIntTypes)) {
        if (! getArithemeticInt16Enabled()) {
            return nullptr;
        }
    }

    if ((convertTo == EbtFloat16 && ! convertFromFloatTypes) ||
        (node->getBasicType() == EbtFloat16 && ! convertToFloatTypes)) {
        if (! getArithemeticFloat16Enabled()) {
            return nullptr;
        }
    }

    TIntermUnary* newNode = nullptr;
    TOperator newOp = EOpNull;
    if (!buildConvertOp(convertTo, node->getBasicType(), newOp)) {
        return nullptr;
    }

    TType newType(convertTo, EvqTemporary, node->getVectorSize(), node->getMatrixCols(), node->getMatrixRows());
    newNode = addUnaryNode(newOp, node, node->getLoc(), newType);

    if (node->getAsConstantUnion()) {
        // 8/16-bit storage extensions don't support 8/16-bit constants, so don't fold conversions
        // to those types
        if ((getArithemeticInt8Enabled() || !(convertTo == EbtInt8 || convertTo == EbtUint8)) &&
            (getArithemeticInt16Enabled() || !(convertTo == EbtInt16 || convertTo == EbtUint16)) &&
            (getArithemeticFloat16Enabled() || !(convertTo == EbtFloat16)))
        {
            TIntermTyped* folded = node->getAsConstantUnion()->fold(newOp, newType);
            if (folded)
                return folded;
        }
    }

    // Propagate specialization-constant-ness, if allowed
    if (node->getType().getQualifier().isSpecConstant() && isSpecializationOperation(*newNode))
        newNode->getWritableType().getQualifier().makeSpecConstant();

    return newNode;
}